

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_store.cpp
# Opt level: O0

buffer * __thiscall mpt::value_store::reserve(value_store *this,long count,type_traits *traits)

{
  content *this_00;
  long lVar1;
  content *local_50;
  buffer *buf;
  content *buf_1;
  size_t len;
  type_traits *traits_local;
  long count_local;
  value_store *this_local;
  
  if (count < 0) {
    this_00 = array::data((array *)this);
    if (this_00 == (content *)0x0) {
      local_50 = (content *)0x0;
    }
    else {
      local_50 = (content *)array::content::length(this_00);
    }
    buf_1 = local_50;
  }
  else {
    buf_1 = (content *)(count * traits->size);
  }
  this_local = (value_store *)mpt_array_reserve(this,buf_1,traits);
  if ((this_local == (value_store *)0x0) || (lVar1 = mpt_array_slice(this,0,buf_1), lVar1 == 0)) {
    this_local = (value_store *)0x0;
  }
  return (buffer *)this_local;
}

Assistant:

buffer *value_store::reserve(long count, const struct type_traits &traits)
{
	size_t len;
	if (count < 0) {
		const array::content *buf = _d.data();
		len = buf ? buf->length() : 0;
	} else {
		len = count * traits.size;
	}
	buffer *buf = mpt_array_reserve(&_d, len, &traits);
	if (!buf || !mpt_array_slice(&_d, 0, len)) {
		return 0;
	}
	return buf;
}